

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# template.c
# Opt level: O3

void abuf_template_init_ext
               (abuf_template_storage *storage,abuf_template_data *data,size_t data_count,
               char *format)

{
  char *__s1;
  byte bVar1;
  int iVar2;
  char cVar3;
  size_t sVar4;
  ulong uVar5;
  long lVar6;
  size_t sVar7;
  ulong uVar8;
  ulong uVar9;
  size_t sVar10;
  abuf_template_data_entry *paVar11;
  bool bVar12;
  
  memset(storage,0,0x610);
  if (format == (char *)0x0) {
    storage->format = "\t";
    if (data_count != 0) {
      sVar7 = 0;
      sVar4 = 0;
      do {
        if (data[sVar4].count != 0) {
          lVar6 = 0;
          uVar8 = 0;
          do {
            storage->indices[sVar7].start = 1;
            sVar7 = storage->count;
            storage->indices[sVar7].end = 0;
            storage->indices[sVar7].data =
                 (abuf_template_data_entry *)((long)&(data[sVar4].data)->key + lVar6);
            sVar7 = sVar7 + 1;
            storage->count = sVar7;
            uVar8 = uVar8 + 1;
            lVar6 = lVar6 + 0x18;
          } while (uVar8 < data[sVar4].count);
        }
        sVar4 = sVar4 + 1;
      } while (sVar4 != data_count);
      if (sVar7 != 0) {
        storage->indices[0].start = 0;
        storage->indices[sVar7 - 1].end = 1;
      }
    }
  }
  else {
    storage->format = format;
    cVar3 = *format;
    if (cVar3 != '\0') {
      bVar12 = true;
      sVar7 = 0;
      uVar9 = 0;
      bVar1 = 0;
      uVar8 = 0;
      do {
        while (uVar5 = uVar8, !(bool)(cVar3 != '%' | bVar1)) {
          if (!bVar12) {
            bVar12 = true;
            if ((uVar5 - uVar9 < 2) || (data_count == 0)) {
              bVar1 = 0;
            }
            else {
              sVar4 = 0;
              do {
                sVar10 = data[sVar4].count;
                if (sVar10 != 0) {
                  paVar11 = data[sVar4].data;
                  do {
                    __s1 = paVar11->key;
                    iVar2 = strncmp(__s1,format + uVar9 + 1,~uVar9 + uVar5);
                    if ((iVar2 == 0) && (__s1[(uVar5 - 1) - uVar9] == '\0')) {
                      storage->indices[sVar7].start = uVar9;
                      sVar7 = storage->count;
                      storage->indices[sVar7].end = uVar5 + 1;
                      storage->indices[sVar7].data = paVar11;
                      sVar7 = sVar7 + 1;
                      storage->count = sVar7;
                      bVar1 = 0;
                      goto LAB_001276aa;
                    }
                    paVar11 = paVar11 + 1;
                    sVar10 = sVar10 - 1;
                  } while (sVar10 != 0);
                }
                sVar4 = sVar4 + 1;
                bVar1 = 0;
              } while (sVar4 != data_count);
            }
            goto LAB_001276aa;
          }
          cVar3 = format[uVar5 + 1];
          bVar12 = false;
          uVar8 = uVar5 + 1;
          uVar9 = uVar5;
          if (cVar3 == '\0') {
            return;
          }
        }
        bVar1 = (bVar1 ^ 1) & cVar3 == '\\';
LAB_001276aa:
        cVar3 = format[uVar5 + 1];
        uVar8 = uVar5 + 1;
      } while (cVar3 != '\0');
    }
  }
  return;
}

Assistant:

void
abuf_template_init_ext(
  struct abuf_template_storage *storage, struct abuf_template_data *data, size_t data_count, const char *format) {
  /* helper string for 'just one tab between keys' */
  static const char default_format[] = "\t";

  struct abuf_template_data_entry *d;
  bool no_open_format = true;
  bool escape = false;
  size_t start = 0;
  size_t pos = 0;
  size_t i, j;

  memset(storage, 0, sizeof(*storage));

  if (!format) {
    /* generate default format, just tab between each value */
    storage->format = default_format;

    storage->count = 0;

    for (j = 0; j < data_count; j++) {
      for (i = 0; i < data[j].count; i++) {
        storage->indices[storage->count].start = 1;
        storage->indices[storage->count].end = 0;
        storage->indices[storage->count].data = &data[j].data[i];
        storage->count++;
      }
    }

    if (storage->count) {
      storage->indices[0].start = 0;
      storage->indices[storage->count - 1].end = 1;
    }
    return;
  }

  storage->format = format;
  while (format[pos]) {
    if (!escape && format[pos] == '%') {
      if (no_open_format) {
        start = pos++;
        no_open_format = false;
        continue;
      }
      if (pos - start > 1) {
        d = _find_template(data, data_count, &format[start + 1], pos - start - 1);
        if (d) {
          storage->indices[storage->count].start = start;
          storage->indices[storage->count].end = pos + 1;
          storage->indices[storage->count].data = d;

          storage->count++;
        }
      }
      no_open_format = true;
    }
    else if (format[pos] == '\\') {
      /* handle "\\" and "\%" in text */
      escape = !escape;
    }
    else {
      escape = false;
    }

    pos++;
  }
}